

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::smallestHoleAtLeast
          (DataLocationUsage *this,DataLocation *location,uint lgSize)

{
  NullableValue<unsigned_int> *other;
  uint *puVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint *t;
  uint local_58 [2];
  uint *local_50;
  uint *result;
  Maybe<unsigned_int> local_38;
  NullableValue<unsigned_int> local_30;
  NullableValue<unsigned_int> _result308;
  uint lgSize_local;
  DataLocation *location_local;
  DataLocationUsage *this_local;
  
  t = (uint *)CONCAT44(in_register_00000014,lgSize);
  if ((location->lgSize & 1) == 0) {
    if (*t < in_ECX) {
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
    }
    else {
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,t);
    }
  }
  else if (in_ECX < *(byte *)((long)&location->lgSize + 1)) {
    HoleSet<unsigned_char>::smallestAtLeast((HoleSet<unsigned_char> *)&local_38,(int)location + 2);
    other = kj::_::readMaybe<unsigned_int>(&local_38);
    kj::_::NullableValue<unsigned_int>::NullableValue(&local_30,other);
    kj::Maybe<unsigned_int>::~Maybe(&local_38);
    puVar1 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_30);
    if (puVar1 == (uint *)0x0) {
      if ((uint)*(byte *)((long)&location->lgSize + 1) < *t) {
        local_58[0] = (uint)*(byte *)((long)&location->lgSize + 1);
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,local_58);
      }
      else {
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
      }
    }
    else {
      local_50 = kj::_::NullableValue<unsigned_int>::operator*(&local_30);
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,local_50);
    }
    local_58[1] = 1;
    kj::_::NullableValue<unsigned_int>::~NullableValue(&local_30);
  }
  else if (in_ECX < *t) {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&_result308.field_1.value);
  }
  else {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<uint> smallestHoleAtLeast(Union::DataLocation& location, uint lgSize) {
        // Find the smallest single hole that is at least the given size.  This is used to find the
        // optimal place to allocate each field -- it is placed in the smallest slot where it fits,
        // to reduce fragmentation.  Returns the size of the hole, if found.

        if (!isUsed) {
          // The location is effectively one big hole.
          if (lgSize <= location.lgSize) {
            return location.lgSize;
          } else {
            return kj::none;
          }
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any current
          // holes, but if the location's size is larger than what we're using, we'd be able to
          // expand.
          if (lgSize < location.lgSize) {
            return lgSize;
          } else {
            return kj::none;
          }
        } else KJ_IF_SOME(result, holes.smallestAtLeast(lgSize)) {
          // There's a hole.
          return result;
        } else {
          // The requested size is smaller than what we're already using, but there are no holes
          // available.  If we could double our size, then we could allocate in the new space.

          if (lgSizeUsed < location.lgSize) {
            // We effectively create a new hole the same size as the current usage.
            return lgSizeUsed;
          } else {
            return kj::none;
          }
        }
      }